

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtualfilesystem.cpp
# Opt level: O2

bool __thiscall sai::VirtualFileSystem::Exists(VirtualFileSystem *this,char *Path)

{
  _Optional_payload_base<sai::VirtualFileEntry> local_80;
  
  GetEntry((optional<sai::VirtualFileEntry> *)&local_80,this,Path);
  std::_Optional_payload_base<sai::VirtualFileEntry>::_M_reset(&local_80);
  return local_80._M_engaged;
}

Assistant:

bool VirtualFileSystem::Exists(const char* Path)
{
	return GetEntry(Path).has_value();
}